

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.cxx
# Opt level: O0

int __thiscall cm::String::copy(String *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  size_type pos_local;
  size_type count_local;
  char *dest_local;
  String *this_local;
  
  iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::copy(&this->view_,dst,src);
  return iVar1;
}

Assistant:

String::size_type String::copy(char* dest, size_type count,
                               size_type pos) const
{
  return this->view_.copy(dest, count, pos);
}